

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throw_exception.hpp
# Opt level: O0

void boost::throw_exception<boost::bad_lexical_cast>(bad_lexical_cast *e)

{
  undefined8 uVar1;
  exception *in_RDI;
  error_info_injector<boost::bad_lexical_cast> *in_stack_ffffffffffffff98;
  
  throw_exception_assert_compatibility(in_RDI);
  uVar1 = __cxa_allocate_exception(0x48);
  enable_error_info<boost::bad_lexical_cast>(&in_stack_ffffffffffffff98->super_bad_lexical_cast);
  enable_current_exception<boost::exception_detail::error_info_injector<boost::bad_lexical_cast>>
            (in_stack_ffffffffffffff98);
  __cxa_throw(uVar1,&exception_detail::
                     clone_impl<boost::exception_detail::error_info_injector<boost::bad_lexical_cast>>
                     ::typeinfo,
              exception_detail::
              clone_impl<boost::exception_detail::error_info_injector<boost::bad_lexical_cast>_>::
              ~clone_impl);
}

Assistant:

BOOST_NORETURN inline void throw_exception( E const & e )
{
    //All boost exceptions are required to derive from std::exception,
    //to ensure compatibility with BOOST_NO_EXCEPTIONS.
    throw_exception_assert_compatibility(e);

#ifndef BOOST_EXCEPTION_DISABLE
    throw enable_current_exception(enable_error_info(e));
#else
    throw e;
#endif
}